

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Var.cpp
# Opt level: O0

uint __thiscall asl::Var::operator_cast_to_unsigned_int(Var *this)

{
  Array<char> *this_00;
  char *__nptr;
  Var *this_local;
  
  switch(this->_type) {
  case NUMBER:
  case FLOAT:
    this_local._4_4_ = (uint)(long)(this->field_1)._d;
    break;
  default:
    this_local._4_4_ = 0;
    break;
  case INT:
    this_local._4_4_ = (this->field_1)._i;
    break;
  case SSTRING:
    this_local._4_4_ = atoi((this->field_1)._ss);
    break;
  case STRING:
    this_00 = StaticSpace<asl::Array<char>_>::operator->(&(this->field_1)._s);
    __nptr = Array<char>::data(this_00);
    this_local._4_4_ = atoi(__nptr);
  }
  return this_local._4_4_;
}

Assistant:

Var::operator unsigned() const
{
	switch(_type) {
	case INT:
		return (unsigned)_i;
	case NUMBER:
	case FLOAT:
		return (unsigned)_d;
	case STRING:
		return (unsigned)atoi(_s->data());
	case SSTRING:
		return (unsigned)atoi(_ss);
	default: break;
	}
	return 0;
}